

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
either<toml::detail::sequence<toml::detail::character<'t'>,_toml::detail::character<'r'>,_toml::detail::character<'u'>,_toml::detail::character<'e'>_>,_toml::detail::sequence<toml::detail::character<'f'>,_toml::detail::character<'a'>,_toml::detail::character<'l'>,_toml::detail::character<'s'>,_toml::detail::character<'e'>_>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_68;
  
  sequence<toml::detail::character<'t'>,_toml::detail::character<'r'>,_toml::detail::character<'u'>,_toml::detail::character<'e'>_>
  ::invoke(&local_68,loc);
  if (local_68.is_ok_ == true) {
    __return_storage_ptr__->is_ok_ = true;
    region::region(&(__return_storage_ptr__->field_1).succ.value,&local_68.field_1.succ.value);
  }
  else {
    sequence<toml::detail::character<'f'>,_toml::detail::character<'a'>,_toml::detail::character<'l'>,_toml::detail::character<'s'>,_toml::detail::character<'e'>_>
    ::invoke(__return_storage_ptr__,loc);
  }
  if (local_68.is_ok_ == true) {
    region::~region(&local_68.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }